

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O2

int __thiscall deqp::gles31::Functional::getNumSamplersInType(Functional *this,VarType *type)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  Functional *this_00;
  ulong uVar6;
  bool bVar7;
  
  iVar5 = 1;
  while( true ) {
    if (*(int *)this != 1) break;
    iVar5 = iVar5 * *(int *)(this + 0x10);
    this = *(Functional **)(this + 8);
  }
  if (*(int *)this == 0) {
    uVar4 = (uint)(*(int *)(this + 8) - 0x27U < 0x1e);
  }
  else {
    lVar1 = *(long *)(*(long *)(this + 8) + 0x20);
    uVar3 = (*(long *)(*(long *)(this + 8) + 0x28) - lVar1) / 0x38;
    uVar4 = 0;
    uVar6 = uVar3 & 0xffffffff;
    if ((int)uVar3 < 1) {
      uVar6 = 0;
    }
    this_00 = (Functional *)(lVar1 + 0x20);
    while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
      iVar2 = getNumSamplersInType(this_00,type);
      uVar4 = uVar4 + iVar2;
      this_00 = this_00 + 0x38;
    }
  }
  return uVar4 * iVar5;
}

Assistant:

static int getNumSamplersInType (const glu::VarType& type)
{
	if (type.isBasicType())
		return glu::isDataTypeSampler(type.getBasicType()) ? 1 : 0;
	else if (type.isArrayType())
		return getNumSamplersInType(type.getElementType()) * type.getArraySize();
	else
	{
		DE_ASSERT(type.isStructType());
		const StructType& structType = *type.getStructPtr();
		int sum = 0;
		for (int i = 0; i < structType.getNumMembers(); i++)
			sum += getNumSamplersInType(structType.getMember(i).getType());
		return sum;
	}
}